

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Expression> __thiscall Parser::primary(Parser *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  Parser *in_RSI;
  ptr<Expression> pVar3;
  shared_ptr<Expression> local_38;
  undefined1 local_28 [8];
  ptr<Expression> expr;
  Parser *this_local;
  ptr<Expression> *expr_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  bVar1 = match(in_RSI,Identifier);
  if (bVar1) {
    variable((Parser *)local_28);
    std::shared_ptr<Expression>::shared_ptr(&local_38,(shared_ptr<Expression> *)local_28);
    postfix(this,(ptr<Expression> *)in_RSI);
    std::shared_ptr<Expression>::~shared_ptr(&local_38);
    std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_28);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    bVar1 = match(in_RSI,LeftParen);
    if (bVar1) {
      consume(in_RSI,LeftParen,"\'(\'");
      expression(this);
      consume(in_RSI,RightParen,"\')\'");
      _Var2._M_pi = extraout_RDX_00;
    }
    else {
      pVar3 = value(this);
      _Var2 = pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
  }
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::primary() {
    if(match(TokenType::Identifier)) {
        ptr<Expression> expr = variable();
        return postfix(expr);
    } else if(match(TokenType::LeftParen)) {
        consume(TokenType::LeftParen, "'('");
        ptr<Expression> expr = expression();
        consume(TokenType::RightParen, "')'");
        return expr;
    } else {
        return value();
    }
}